

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O3

EncounteredQmlMacro __thiscall Moc::parseClassInfo(Moc *this,BaseDef *def)

{
  long lVar1;
  long lVar2;
  long lVar3;
  Symbol *pSVar4;
  bool bVar5;
  QTypeRevision QVar6;
  long in_FS_OFFSET;
  QByteArrayView haystack;
  QByteArrayView needle;
  QByteArray local_78;
  ClassInfoDef local_60;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = (this->super_Parser).symbols.d.size;
  lVar3 = (this->super_Parser).index;
  if ((lVar2 <= lVar3) ||
     (pSVar4 = (this->super_Parser).symbols.d.ptr, pSVar4[lVar3].token != LPAREN))
  goto LAB_00128623;
  lVar1 = lVar3 + 1;
  (this->super_Parser).index = lVar1;
  local_60.value.d.d = (Data *)0x0;
  local_60.value.d.ptr = (storage_type *)0x0;
  local_60.value.d.size = 0;
  if ((lVar2 <= lVar1) || (pSVar4[lVar1].token != PP_STRING_LITERAL)) goto LAB_00128623;
  (this->super_Parser).index = lVar3 + 2;
  QByteArray::mid(&local_78,&pSVar4[lVar3 + 1].lex,pSVar4[lVar3 + 1].from + 1,
                  pSVar4[lVar3 + 1].len + -2);
  local_60.name.d.ptr = local_78.d.ptr;
  local_60.name.d.d = local_78.d.d;
  local_78.d.d = (Data *)0x0;
  local_78.d.ptr = (storage_type *)0x0;
  local_60.name.d.size = local_78.d.size;
  lVar2 = (this->super_Parser).symbols.d.size;
  lVar3 = (this->super_Parser).index;
  haystack.m_data = local_60.name.d.ptr;
  haystack.m_size = local_78.d.size;
  needle.m_data = "QML.";
  needle.m_size = 4;
  bVar5 = QtPrivate::startsWith(haystack,needle);
  if ((lVar2 <= lVar3) ||
     (pSVar4 = (this->super_Parser).symbols.d.ptr, pSVar4[lVar3].token != COMMA)) goto LAB_00128623;
  lVar1 = lVar3 + 1;
  (this->super_Parser).index = lVar1;
  if (lVar2 <= lVar1) goto LAB_00128623;
  if (pSVar4[lVar1].token == PP_STRING_LITERAL) {
    (this->super_Parser).index = lVar3 + 2;
    QByteArray::mid(&local_78,&pSVar4[lVar3 + 1].lex,pSVar4[lVar3 + 1].from + 1,
                    pSVar4[lVar3 + 1].len + -2);
LAB_0012848c:
    local_60.value.d.d = local_78.d.d;
    local_60.value.d.ptr = local_78.d.ptr;
    local_60.value.d.size = local_78.d.size;
  }
  else {
    if (pSVar4[lVar1].token == Q_REVISION_TOKEN) {
      (this->super_Parser).index = lVar3 + 2;
      QVar6 = parseRevision(this);
      QByteArray::number(&local_78,(uint)(ushort)QVar6,10);
      goto LAB_0012848c;
    }
    if (pSVar4[lVar1].token != IDENTIFIER) goto LAB_00128623;
    lVar1 = lVar3 + 2;
    (this->super_Parser).index = lVar1;
    if ((lVar2 <= lVar1) || (pSVar4[lVar1].token != LPAREN)) goto LAB_00128623;
    lVar1 = lVar3 + 3;
    (this->super_Parser).index = lVar1;
    if ((lVar2 <= lVar1) || (pSVar4[lVar1].token != PP_STRING_LITERAL)) goto LAB_00128623;
    (this->super_Parser).index = lVar3 + 4;
    QByteArray::mid(&local_78,&pSVar4[lVar3 + 3].lex,pSVar4[lVar3 + 3].from + 1,
                    pSVar4[lVar3 + 3].len + -2);
    local_60.value.d.ptr = local_78.d.ptr;
    local_60.value.d.d = local_78.d.d;
    local_78.d.d = (Data *)0x0;
    local_78.d.ptr = (storage_type *)0x0;
    local_60.value.d.size = local_78.d.size;
    lVar2 = (this->super_Parser).index;
    if (((this->super_Parser).symbols.d.size <= lVar2) ||
       ((this->super_Parser).symbols.d.ptr[lVar2].token != PP_RPAREN)) goto LAB_00128623;
    (this->super_Parser).index = lVar2 + 1;
  }
  lVar2 = (this->super_Parser).index;
  if ((lVar2 < (this->super_Parser).symbols.d.size) &&
     ((this->super_Parser).symbols.d.ptr[lVar2].token == PP_RPAREN)) {
    (this->super_Parser).index = lVar2 + 1;
    QtPrivate::QMovableArrayOps<ClassInfoDef>::emplace<ClassInfoDef_const&>
              ((QMovableArrayOps<ClassInfoDef> *)&def->classInfoList,(def->classInfoList).d.size,
               &local_60);
    QList<ClassInfoDef>::end(&def->classInfoList);
    if (&(local_60.value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if (((local_60.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_60.value.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (&(local_60.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_60.name.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return (EncounteredQmlMacro)!bVar5;
    }
    __stack_chk_fail();
  }
LAB_00128623:
  Parser::error(&this->super_Parser,(char *)0x0);
}

Assistant:

Moc::EncounteredQmlMacro Moc::parseClassInfo(BaseDef *def)
{
    bool encounteredQmlMacro = false;
    next(LPAREN);
    ClassInfoDef infoDef;
    next(STRING_LITERAL);
    infoDef.name = symbol().unquotedLexem();
    if (infoDef.name.startsWith("QML."))
        encounteredQmlMacro = true;
    next(COMMA);
    if (test(STRING_LITERAL)) {
        infoDef.value = symbol().unquotedLexem();
    } else if (test(Q_REVISION_TOKEN)) {
        infoDef.value = QByteArray::number(parseRevision().toEncodedVersion<quint16>());
    } else {
        // support Q_CLASSINFO("help", QT_TR_NOOP("blah"))
        next(IDENTIFIER);
        next(LPAREN);
        next(STRING_LITERAL);
        infoDef.value = symbol().unquotedLexem();
        next(RPAREN);
    }
    next(RPAREN);
    def->classInfoList += infoDef;
    return encounteredQmlMacro ? EncounteredQmlMacro::Yes : EncounteredQmlMacro::No;
}